

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O0

char * __thiscall TadsHttpReqResult::find_header(TadsHttpReqResult *this,char *name)

{
  int iVar1;
  size_t sVar2;
  TadsHttpReqResult *this_00;
  char *in_RSI;
  char *in_RDI;
  bool bVar3;
  char *p;
  size_t namelen;
  
  sVar2 = strlen(in_RSI);
  this_00 = *(TadsHttpReqResult **)(in_RDI + 0x58);
  do {
    if (this_00 == (TadsHttpReqResult *)0x0) {
      return (char *)0x0;
    }
    while( true ) {
      bVar3 = false;
      if (*(char *)&(this_00->super_TadsEventMessage).super_TadsMessage.super_CVmRefCntObj.
                    _vptr_CVmRefCntObj != '\0') {
        iVar1 = is_space(L'\0');
        bVar3 = iVar1 != 0;
      }
      if (!bVar3) break;
      this_00 = (TadsHttpReqResult *)
                ((long)&(this_00->super_TadsEventMessage).super_TadsMessage.super_CVmRefCntObj.
                        _vptr_CVmRefCntObj + 1);
    }
    iVar1 = memicmp(name,(void *)namelen,(size_t)p);
    if (iVar1 == 0) {
      this_00 = (TadsHttpReqResult *)
                ((long)&(this_00->super_TadsEventMessage).super_TadsMessage.super_CVmRefCntObj.
                        _vptr_CVmRefCntObj + sVar2);
      while( true ) {
        bVar3 = false;
        if (*(char *)&(this_00->super_TadsEventMessage).super_TadsMessage.super_CVmRefCntObj.
                      _vptr_CVmRefCntObj != '\0') {
          iVar1 = is_space(L'\0');
          bVar3 = iVar1 != 0;
        }
        if (!bVar3) break;
        this_00 = (TadsHttpReqResult *)
                  ((long)&(this_00->super_TadsEventMessage).super_TadsMessage.super_CVmRefCntObj.
                          _vptr_CVmRefCntObj + 1);
      }
      if (*(char *)&(this_00->super_TadsEventMessage).super_TadsMessage.super_CVmRefCntObj.
                    _vptr_CVmRefCntObj == ':') {
        do {
          this_00 = (TadsHttpReqResult *)
                    ((long)&(this_00->super_TadsEventMessage).super_TadsMessage.super_CVmRefCntObj.
                            _vptr_CVmRefCntObj + 1);
          bVar3 = false;
          if (*(char *)&(this_00->super_TadsEventMessage).super_TadsMessage.super_CVmRefCntObj.
                        _vptr_CVmRefCntObj != '\0') {
            iVar1 = is_space(L'\0');
            bVar3 = iVar1 != 0;
          }
        } while (bVar3);
        return (char *)this_00;
      }
    }
    this_00 = (TadsHttpReqResult *)next_header(this_00,in_RDI);
  } while( true );
}

Assistant:

const char *find_header(const char *name)
    {
        /* remember the name length */
        size_t namelen = strlen(name);

        /* scan the headers */
        for (const char *p = hdrs ; p != 0 ; p = next_header(p))
        {
            /* skip spaces */
            for ( ; *p != '\0' && is_space(*p) ; ++p) ;

            /* check for a match */
            if (memicmp(p, name, namelen) == 0)
            {
                /* skip the name and any subsequent spaces */
                for (p += namelen ; *p != '\0' && is_space(*p) ; ++p) ;

                /* make sure we have a ':' */
                if (*p == ':')
                {
                    /* skip the ':' and subsequent spaces */
                    for (p += 1 ; *p != '\0' && is_space(*p) ; ++p) ;

                    /* this is the start of the header value */
                    return p;
                }
            }
        }

        /* didn't find it */
        return 0;
    }